

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

int __thiscall EvaluatorMopUp::Evaluate(EvaluatorMopUp *this,Position *pos)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  int iVar4;
  uint j;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint i;
  uint uVar8;
  float fVar9;
  uint local_48;
  int local_44;
  
  fVar9 = Material::GetPhase(&pos->m_Material);
  if (fVar9 < 0.9) {
    return 0;
  }
  iVar3 = 0;
  uVar7 = 0;
  local_48 = 0;
  local_44 = 0;
  for (uVar8 = 0; uVar8 != 8; uVar8 = uVar8 + 1) {
    uVar6 = uVar8;
    for (iVar5 = 0; iVar5 != 8; iVar5 = iVar5 + 1) {
      iVar2 = (*(pos->m_Board).super_BoardPieceSquare.super_BoardHashing.super_BoardBase.
                _vptr_BoardBase[1])(&pos->m_Board,(ulong)uVar6);
      uVar1 = uVar8;
      iVar4 = iVar5;
      if (((King *)CONCAT44(extraout_var,iVar2) != &WhiteKing) &&
         (uVar1 = local_48, iVar4 = local_44, (King *)CONCAT44(extraout_var,iVar2) == &BlackKing)) {
        iVar3 = iVar5;
        uVar7 = uVar8;
      }
      local_44 = iVar4;
      local_48 = uVar1;
      uVar6 = uVar6 + 8;
    }
  }
  iVar4 = local_48 - uVar7;
  iVar5 = -iVar4;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  local_44 = local_44 - iVar3;
  iVar3 = -local_44;
  if (0 < local_44) {
    iVar3 = local_44;
  }
  iVar3 = (*(this->super_EvaluatorBase)._vptr_EvaluatorBase[1])
                    (this,pos,(ulong)(uint)((6 - (iVar3 + iVar5)) * 100));
  return iVar3;
}

Assistant:

virtual int Evaluate( Position &pos ) const
    {
        const float fTurnOnAt = 0.9f;

        if ( pos.GetPhase() < fTurnOnAt )
            return 0;

        Square localWhiteKing, localBlackKing;

        for ( unsigned int i = 0; i < MAX_FILES; i++ )
        {
            for ( unsigned int j = 0; j < MAX_FILES; j++ )
            {
                Square cur( i, j );
                const Piece *pPiece = pos.GetBoard().Get( cur );

                if ( pPiece == &WhiteKing )
                    localWhiteKing = cur;

                if ( pPiece == &BlackKing )
                    localBlackKing = cur;
            }
        }

        return Bias( pos, ( 6 - localWhiteKing.ManhattanDistanceTo(
                                localBlackKing ) ) * 100 );
    }